

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::LowerBailOnInvalidatedArrayHeadSegment(Lowerer *this,Instr *instr,bool isInHelperBlock)

{
  OpCode OVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  IndirOpnd *pIVar6;
  ArrayRegOpnd *pAVar7;
  RegOpnd *opnd;
  StackSym *pSVar8;
  Instr *pIVar9;
  LabelInstr *target;
  Instr *this_00;
  RegOpnd *pRVar10;
  Lowerer *pLVar11;
  Opnd *this_01;
  LowererMD *pLVar12;
  undefined1 local_a8 [8];
  AutoReuseOpnd autoReuseInvalidatedHeadSegmentOpnd;
  AutoReuseOpnd autoReuseHeadSegmentBeforeHelperCallOpnd;
  AutoReuseOpnd autoReuseHeadSegmentLengthBeforeHelperCallOpnd;
  RegOpnd *local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  Lowerer *pLStack_38;
  ValueType baseValueType;
  
  pLStack_38 = this;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3415,"(instr)","instr");
    if (!bVar3) goto LAB_0056eef5;
    *puVar5 = 0;
  }
  OVar1 = instr->m_opcode;
  if (((1 < OVar1 - 0x203) && (OVar1 != StElemI_A)) && (OVar1 != StElemI_A_Strict)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3416,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar3) goto LAB_0056eef5;
    *puVar5 = 0;
  }
  this_01 = instr->m_dst;
  if (this_01 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3417,"(instr->GetDst())","instr->GetDst()");
    if (!bVar3) goto LAB_0056eef5;
    *puVar5 = 0;
    this_01 = instr->m_dst;
  }
  pLVar11 = pLStack_38;
  bVar3 = IR::Opnd::IsIndirOpnd(this_01);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3418,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar3) goto LAB_0056eef5;
    *puVar5 = 0;
    pLVar11 = pLStack_38;
  }
  func = instr->m_func;
  pIVar6 = IR::Opnd::AsIndirOpnd(instr->m_dst);
  pRVar10 = pIVar6->m_baseOpnd;
  local_3a = (pRVar10->super_Opnd).m_valueType.field_0;
  bVar3 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_3a.field_0);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x341e,"(!baseValueType.IsNotArrayOrObjectWithArray())",
                       "!baseValueType.IsNotArrayOrObjectWithArray()");
    if (!bVar3) {
LAB_0056eef5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pLVar11 = pLStack_38;
  }
  bVar3 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_3a.field_0);
  bVar4 = IR::RegOpnd::IsArrayRegOpnd(pRVar10);
  if (bVar4) {
    pAVar7 = IR::RegOpnd::AsArrayRegOpnd(pRVar10);
  }
  else {
    pAVar7 = (ArrayRegOpnd *)0x0;
  }
  autoReuseInvalidatedHeadSegmentOpnd.autoDelete = false;
  autoReuseInvalidatedHeadSegmentOpnd.wasInUse = false;
  autoReuseInvalidatedHeadSegmentOpnd._18_6_ = 0;
  autoReuseHeadSegmentBeforeHelperCallOpnd.func._1_1_ = 1;
  bVar4 = pAVar7 == (ArrayRegOpnd *)0x0;
  if ((!bVar3 || bVar4) || (pAVar7->headSegmentSym == (StackSym *)0x0)) {
    LowererMD::LoadHelperArgument(&pLVar11->m_lowererMD,instr,&pRVar10->super_Opnd);
    pIVar9 = IR::Instr::New(Call,func);
    pSVar8 = StackSym::New(TyUint64,func);
    local_48 = IR::RegOpnd::New(pSVar8,TyUint64,func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseInvalidatedHeadSegmentOpnd.autoDelete,
               &local_48->super_Opnd,func,true);
    IR::Instr::SetDst(pIVar9,&local_48->super_Opnd);
    IR::Instr::InsertBefore(instr,pIVar9);
    LowererMD::ChangeToHelperCall
              (&pLVar11->m_lowererMD,pIVar9,
               HelperArray_Jit_GetArrayHeadSegmentForArrayOrObjectWithArray,(LabelInstr *)0x0,
               (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
    if (bVar3 && !bVar4) goto LAB_0056ecfa;
  }
  else {
    local_48 = IR::RegOpnd::New(pAVar7->headSegmentSym,TyUint64,func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseInvalidatedHeadSegmentOpnd.autoDelete,
               &local_48->super_Opnd,func,true);
LAB_0056ecfa:
    autoReuseHeadSegmentBeforeHelperCallOpnd.autoDelete = false;
    autoReuseHeadSegmentBeforeHelperCallOpnd.wasInUse = false;
    autoReuseHeadSegmentBeforeHelperCallOpnd._18_6_ = 0;
    if (pAVar7->headSegmentLengthSym != (StackSym *)0x0) {
      opnd = IR::RegOpnd::New(pAVar7->headSegmentLengthSym,TyUint32,func);
      IR::AutoReuseOpnd::Initialize
                ((AutoReuseOpnd *)&autoReuseHeadSegmentBeforeHelperCallOpnd.autoDelete,
                 &opnd->super_Opnd,func,true);
      goto LAB_0056edeb;
    }
  }
  autoReuseHeadSegmentBeforeHelperCallOpnd.autoDelete = false;
  autoReuseHeadSegmentBeforeHelperCallOpnd.wasInUse = false;
  autoReuseHeadSegmentBeforeHelperCallOpnd._18_6_ = 0;
  pSVar8 = StackSym::New(TyUint32,func);
  opnd = IR::RegOpnd::New(pSVar8,TyUint32,func);
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseHeadSegmentBeforeHelperCallOpnd.autoDelete,&opnd->super_Opnd
             ,func,true);
  if ((!bVar3 || bVar4) || (pAVar7->headSegmentSym == (StackSym *)0x0)) {
    pLVar12 = &pLStack_38->m_lowererMD;
    LowererMD::LoadHelperArgument(pLVar12,instr,&local_48->super_Opnd);
    pIVar9 = IR::Instr::New(Call,func);
    IR::Instr::SetDst(pIVar9,&opnd->super_Opnd);
    IR::Instr::InsertBefore(instr,pIVar9);
    LowererMD::ChangeToHelperCall
              (pLVar12,pIVar9,HelperArray_Jit_GetArrayHeadSegmentLength,(LabelInstr *)0x0,
               (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  }
  else {
    pIVar6 = IR::IndirOpnd::New(local_48,4,TyUint32,func,false);
    InsertMove(&opnd->super_Opnd,&pIVar6->super_Opnd,instr,true);
  }
LAB_0056edeb:
  target = IR::Instr::GetOrCreateContinueLabel(instr,isInHelperBlock);
  pLVar11 = pLStack_38;
  LowerOneBailOutKind(pLStack_38,instr,BailOutOnInvalidatedArrayHeadSegment,false,false);
  pIVar9 = instr->m_next;
  pLVar12 = &pLVar11->m_lowererMD;
  LowererMD::LoadHelperArgument(pLVar12,pIVar9,&pRVar10->super_Opnd);
  LowererMD::LoadHelperArgument(pLVar12,pIVar9,&opnd->super_Opnd);
  LowererMD::LoadHelperArgument(pLVar12,pIVar9,&local_48->super_Opnd);
  this_00 = IR::Instr::New(Call,func);
  pRVar10 = IR::RegOpnd::New(TyUint8,func);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_a8,&pRVar10->super_Opnd,func,true);
  IR::Instr::SetDst(this_00,&pRVar10->super_Opnd);
  IR::Instr::InsertBefore(pIVar9,this_00);
  LowererMD::ChangeToHelperCall
            (pLVar12,this_00,HelperArray_Jit_OperationInvalidatedArrayHeadSegment,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  InsertTestBranch(&pRVar10->super_Opnd,&pRVar10->super_Opnd,BrEq_A,target,pIVar9);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_a8);
  IR::AutoReuseOpnd::~AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseHeadSegmentBeforeHelperCallOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseInvalidatedHeadSegmentOpnd.autoDelete);
  return;
}

Assistant:

void Lowerer::LowerBailOnInvalidatedArrayHeadSegment(IR::Instr *const instr, const bool isInHelperBlock)
{
    /*
        // Generate checks for whether the head segment or the head segment length changed during the helper call

        if(!(baseValueType.IsArrayOrObjectWithArray() && arrayOpnd && arrayOpnd.HeadSegmentSym()))
        {
            // Record the array head segment before the helper call
            headSegmentBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayHeadSegmentForArrayOrObjectWithArray(base)
        }
        if(!(baseValueType.IsArrayOrObjectWithArray() && arrayOpnd && arrayOpnd.HeadSegmentLengthSym()))
        {
            // Record the array head segment length before the helper call
            if(baseValueType.IsArrayOrObjectWithArray() && arrayOpnd && arrayOpnd.HeadSegmentSym())
            {
                mov headSegmentLengthBeforeHelperCall, [headSegmentBeforeHelperCall + offsetOf(length)]
            }
            else
            {
                headSegmentLengthBeforeHelperCall =
                    Js::JavascriptArray::Jit_GetArrayHeadSegmentLength(headSegmentBeforeHelperCall)
            }
        }

        helperCall:
            (Helper call and other bailout checks)

        // If the array has a different head segment or head segment length after the helper call, then this store needs to bail
        // out
        invalidatedHeadSegment =
            JavascriptArray::Jit_OperationInvalidatedArrayHeadSegment(
                headSegmentBeforeHelperCall,
                headSegmentLengthBeforeHelperCall,
                base)
        test invalidatedHeadSegment, invalidatedHeadSegment
        jz $skipBailOut

        (Bail out with IR::BailOutOnInvalidatedArrayHeadSegment)

        $skipBailOut:
    */

    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    Assert(instr->GetDst());
    Assert(instr->GetDst()->IsIndirOpnd());

    Func *const func = instr->m_func;

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    Assert(!baseValueType.IsNotArrayOrObjectWithArray());
    const bool isArrayOrObjectWithArray = baseValueType.IsArrayOrObjectWithArray();
    IR::ArrayRegOpnd *const arrayOpnd = baseOpnd->IsArrayRegOpnd() ? baseOpnd->AsArrayRegOpnd() : nullptr;

    IR::RegOpnd *headSegmentBeforeHelperCallOpnd;
    IR::AutoReuseOpnd autoReuseHeadSegmentBeforeHelperCallOpnd;
    if(isArrayOrObjectWithArray && arrayOpnd && arrayOpnd->HeadSegmentSym())
    {
        headSegmentBeforeHelperCallOpnd = IR::RegOpnd::New(arrayOpnd->HeadSegmentSym(), TyMachPtr, func);
        autoReuseHeadSegmentBeforeHelperCallOpnd.Initialize(headSegmentBeforeHelperCallOpnd, func);
    }
    else
    {
        // Record the array head segment before the helper call
        //     headSegmentBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayHeadSegmentForArrayOrObjectWithArray(base)
        m_lowererMD.LoadHelperArgument(instr, baseOpnd);
        IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
        headSegmentBeforeHelperCallOpnd = IR::RegOpnd::New(StackSym::New(TyMachPtr, func), TyMachPtr, func);
        autoReuseHeadSegmentBeforeHelperCallOpnd.Initialize(headSegmentBeforeHelperCallOpnd, func);
        callInstr->SetDst(headSegmentBeforeHelperCallOpnd);
        instr->InsertBefore(callInstr);
        m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayHeadSegmentForArrayOrObjectWithArray);
    }

    IR::RegOpnd *headSegmentLengthBeforeHelperCallOpnd;
    IR::AutoReuseOpnd autoReuseHeadSegmentLengthBeforeHelperCallOpnd;
    if(isArrayOrObjectWithArray && arrayOpnd && arrayOpnd->HeadSegmentLengthSym())
    {
        headSegmentLengthBeforeHelperCallOpnd = IR::RegOpnd::New(arrayOpnd->HeadSegmentLengthSym(), TyUint32, func);
        autoReuseHeadSegmentLengthBeforeHelperCallOpnd.Initialize(headSegmentLengthBeforeHelperCallOpnd, func);
    }
    else
    {
        headSegmentLengthBeforeHelperCallOpnd = IR::RegOpnd::New(StackSym::New(TyUint32, func), TyUint32, func);
        autoReuseHeadSegmentLengthBeforeHelperCallOpnd.Initialize(headSegmentLengthBeforeHelperCallOpnd, func);
        if(isArrayOrObjectWithArray && arrayOpnd && arrayOpnd->HeadSegmentSym())
        {
            // Record the array head segment length before the helper call
            //     mov headSegmentLengthBeforeHelperCall, [headSegmentBeforeHelperCall + offsetOf(length)]
            InsertMove(
                headSegmentLengthBeforeHelperCallOpnd,
                IR::IndirOpnd::New(
                    headSegmentBeforeHelperCallOpnd,
                    Js::SparseArraySegmentBase::GetOffsetOfLength(),
                    TyUint32,
                    func),
                instr);
        }
        else
        {
            // Record the array head segment length before the helper call
            //     headSegmentLengthBeforeHelperCall =
            //         Js::JavascriptArray::Jit_GetArrayHeadSegmentLength(headSegmentBeforeHelperCall)
            m_lowererMD.LoadHelperArgument(instr, headSegmentBeforeHelperCallOpnd);
            IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
            callInstr->SetDst(headSegmentLengthBeforeHelperCallOpnd);
            instr->InsertBefore(callInstr);
            m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayHeadSegmentLength);
        }
    }

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isInHelperBlock);
    LowerOneBailOutKind(instr, IR::BailOutOnInvalidatedArrayHeadSegment, isInHelperBlock);
    IR::Instr *const insertBeforeInstr = instr->m_next;

    // If the array has a different head segment or head segment length after the helper call, then this store needs to bail out
    //     invalidatedHeadSegment =
    //         JavascriptArray::Jit_OperationInvalidatedArrayHeadSegment(
    //             headSegmentBeforeHelperCall,
    //             headSegmentLengthBeforeHelperCall,
    //             base)
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, baseOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, headSegmentLengthBeforeHelperCallOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, headSegmentBeforeHelperCallOpnd);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    IR::RegOpnd *const invalidatedHeadSegmentOpnd = IR::RegOpnd::New(TyUint8, func);
    const IR::AutoReuseOpnd autoReuseInvalidatedHeadSegmentOpnd(invalidatedHeadSegmentOpnd, func);
    callInstr->SetDst(invalidatedHeadSegmentOpnd);
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_OperationInvalidatedArrayHeadSegment);

    //     test invalidatedHeadSegment, invalidatedHeadSegment
    //     jz $skipBailOut
    InsertTestBranch(
        invalidatedHeadSegmentOpnd,
        invalidatedHeadSegmentOpnd,
        Js::OpCode::BrEq_A,
        skipBailOutLabel,
        insertBeforeInstr);

    //     (Bail out with IR::BailOutOnInvalidatedArrayHeadSegment)
    //     $skipBailOut:
}